

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Uint(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
       *this,uint u)

{
  bool bVar1;
  SchemaType *this_00;
  Context *context_00;
  char *pcVar2;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar3;
  bool local_6a;
  bool local_69;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_68;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_58;
  uint local_30;
  uint local_2c;
  SizeType i__1;
  SizeType i_;
  Context *context;
  uint u_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  if ((this->valid_ & 1U) == 0) {
    return false;
  }
  bVar1 = BeginValue(this);
  if ((!bVar1) && (bVar1 = GetContinueOnErrors(this), !bVar1)) {
LAB_00158bdb:
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
    *pcVar2 = '\0';
    internal::Stack<rapidjson::CrtAllocator>::Pop<char>(&this->documentStack_,1);
    this->valid_ = false;
    return (bool)(this->valid_ & 1);
  }
  this_00 = CurrentSchema(this);
  context_00 = CurrentContext(this);
  bVar1 = internal::
          Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
          ::Uint(this_00,context_00,u);
  if ((!bVar1) && (bVar1 = GetContinueOnErrors(this), !bVar1)) goto LAB_00158bdb;
  for (_i__1 = internal::Stack<rapidjson::CrtAllocator>::
               Bottom<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (&this->schemaStack_);
      pSVar3 = internal::Stack<rapidjson::CrtAllocator>::
               End<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (&this->schemaStack_), _i__1 != pSVar3; _i__1 = _i__1 + 1) {
    if (_i__1->hasher != (void *)0x0) {
      internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Uint
                ((Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)_i__1->hasher,u);
    }
    if (_i__1->validators != (ISchemaValidator **)0x0) {
      for (local_2c = 0; local_2c < _i__1->validatorCount; local_2c = local_2c + 1) {
        if (_i__1->validators[local_2c] == (ISchemaValidator *)0x0) {
          local_58 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)0x0;
        }
        else {
          local_58 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)(_i__1->validators[local_2c] + -1);
        }
        Uint(local_58,u);
      }
    }
    if (_i__1->patternPropertiesValidators != (ISchemaValidator **)0x0) {
      for (local_30 = 0; local_30 < _i__1->patternPropertiesValidatorCount; local_30 = local_30 + 1)
      {
        if (_i__1->patternPropertiesValidators[local_30] == (ISchemaValidator *)0x0) {
          local_68 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)0x0;
        }
        else {
          local_68 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)(_i__1->patternPropertiesValidators[local_30] + -1);
        }
        Uint(local_68,u);
      }
    }
  }
  bVar1 = EndValue(this);
  if (!bVar1) {
    bVar1 = GetContinueOnErrors(this);
    local_69 = false;
    if (!bVar1) goto LAB_00158da2;
  }
  local_6a = true;
  if (this->outputHandler_ != (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0) {
    local_6a = BaseReaderHandler<rapidjson::UTF8<char>,_void>::Uint(this->outputHandler_,u);
  }
  local_69 = local_6a;
LAB_00158da2:
  this->valid_ = local_69;
  return (bool)(this->valid_ & 1);
}

Assistant:

bool Uint(unsigned u)   { RAPIDJSON_SCHEMA_HANDLE_VALUE_(Uint,   (CurrentContext(), u), (u)); }